

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::TestRegistry::sortTests
               (IConfig *config,
               vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases)

{
  int iVar1;
  RandomNumberGenerator rng;
  RandomNumberGenerator local_9;
  
  iVar1 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])();
  if (iVar1 == 2) {
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::TestRegistry::RandomNumberGenerator&>
              ((matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_9);
  }
  else if (iVar1 == 1) {
    std::
    __sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::TestRegistry::LexSort>>
              ((matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    return;
  }
  return;
}

Assistant:

static void sortTests( IConfig const& config, std::vector<TestCase>& matchingTestCases ) {

            switch( config.runOrder() ) {
                case RunTests::InLexicographicalOrder:
                    std::sort( matchingTestCases.begin(), matchingTestCases.end(), LexSort() );
                    break;
                case RunTests::InRandomOrder:
                {
                    RandomNumberGenerator rng;
                    std::random_shuffle( matchingTestCases.begin(), matchingTestCases.end(), rng );
                }
                    break;
                case RunTests::InDeclarationOrder:
                    // already in declaration order
                    break;
            }
        }